

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_roundtrip_test.cxx
# Opt level: O0

void test_linear_roundtrip<cryptox::symmetric_algorithm<&EVP_des_cfb64>>(size_t buffer_size)

{
  ulong uVar1;
  size_type sVar2;
  allocator<unsigned_char> local_f1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  int local_c0;
  int i;
  undefined1 local_b0 [8];
  buffer_type master;
  endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_cfb64>_> endec;
  size_t buffer_size_local;
  
  cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_cfb64>_>::
  endec_pair_tester((endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_cfb64>_> *)
                    &master.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  cryptox::detail::make_random_vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,buffer_size);
  local_c0 = 0;
  while( true ) {
    uVar1 = (ulong)local_c0;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0);
    if (sVar2 < uVar1) break;
    local_e0._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0);
    local_f0._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0);
    local_e8 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_f0,(long)local_c0);
    std::allocator<unsigned_char>::allocator(&local_f1);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_d8,local_e0,local_e8,
               &local_f1);
    cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_cfb64>>::
    check_roundtrip<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_cfb64>> *)
               &master.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_d8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_d8);
    std::allocator<unsigned_char>::~allocator(&local_f1);
    local_c0 = local_c0 + 1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0);
  cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_cfb64>_>::
  ~endec_pair_tester((endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_cfb64>_> *)
                     &master.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

static void test_linear_roundtrip(const size_t buffer_size = 4096) {
	cryptox::tests::endec_pair_tester<Algorithm> endec;

	typedef std::vector<std::uint8_t> buffer_type;

	using cryptox::detail::make_random_vector;
	const buffer_type master = make_random_vector(buffer_size);
	for (int i=0; i<=master.size(); ++i) {
		endec.check_roundtrip(
			buffer_type(master.begin(), master.begin() + i)
		);
	}
}